

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O2

void fy_node_apply(fy_node *fyn,fy_node_applyf func)

{
  byte bVar1;
  list_head *plVar2;
  fy_node *fyn_00;
  
  if (func != (fy_node_applyf)0x0 && fyn != (fy_node *)0x0) {
    (*func)(fyn);
    bVar1 = fyn->field_0x34 & 3;
    if (bVar1 == 2) {
      plVar2 = (list_head *)&fyn->field_12;
      while( true ) {
        plVar2 = ((list_head *)&plVar2->next)->next;
        if (plVar2 == (list_head *)&fyn->field_12) {
          plVar2 = (list_head *)0x0;
        }
        if (plVar2 == (list_head *)0x0) break;
        fy_node_apply((fy_node *)plVar2[1].next,func);
        fy_node_apply((fy_node *)plVar2[1].prev,func);
      }
    }
    else if (bVar1 == 1) {
      fyn_00 = (fy_node *)&fyn->field_12;
      while( true ) {
        fyn_00 = (fy_node *)(fyn_00->node).next;
        if (fyn_00 == (fy_node *)&fyn->field_12) {
          fyn_00 = (fy_node *)0x0;
        }
        if (fyn_00 == (fy_node *)0x0) break;
        fy_node_apply(fyn_00,func);
      }
    }
  }
  return;
}

Assistant:

void fy_node_apply(struct fy_node *fyn, fy_node_applyf func) {
    struct fy_node *fyni;
    struct fy_node_pair *fynp;

    if (!fyn || !func)
        return;

    (*func)(fyn);

    switch (fyn->type) {
        case FYNT_SCALAR:
            break;

        case FYNT_SEQUENCE:
            for (fyni = fy_node_list_head(&fyn->sequence); fyni;
                 fyni = fy_node_next(&fyn->sequence, fyni))
                fy_node_apply(fyni, func);
            break;

        case FYNT_MAPPING:
            for (fynp = fy_node_pair_list_head(&fyn->mapping); fynp;
                 fynp = fy_node_pair_next(&fyn->mapping, fynp)) {

                fy_node_apply(fynp->key, func);
                fy_node_apply(fynp->value, func);
            }
            break;
    }
}